

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O1

size_t propagatemark(global_State *g)

{
  uint8_t uVar1;
  char cVar2;
  ushort uVar3;
  uint uVar4;
  uint32_t uVar5;
  GCfunc *fn;
  uint64_t uVar6;
  ulong uVar7;
  lua_CFunction p_Var8;
  uint uVar9;
  cTValue *pcVar10;
  char *pcVar11;
  long lVar12;
  GCtab *t;
  ulong uVar13;
  GCobj *pGVar14;
  uint uVar15;
  lua_CFunction p_Var16;
  uint uVar17;
  ulong uVar18;
  
  fn = (GCfunc *)(g->gc).gray.gcptr64;
  uVar1 = (fn->c).gct;
  (fn->c).marked = (fn->c).marked | 4;
  (g->gc).gray.gcptr64 = (fn->c).gclist.gcptr64;
  if (uVar1 != '\v') {
    if (uVar1 == '\b') {
      gc_traverse_func(g,fn);
      lVar12 = (ulong)(fn->c).nupvalues * 8;
      if ((fn->c).ffid != '\0') {
        return lVar12 + 0x30;
      }
      return lVar12 + 0x28;
    }
    if (uVar1 == '\a') {
      gc_traverse_proto(g,(GCproto *)&fn->c);
      return (ulong)*(uint *)(fn + 1);
    }
    if (uVar1 == '\x06') {
      (fn->c).gclist.gcptr64 = (g->gc).grayagain.gcptr64;
      (g->gc).grayagain.gcptr64 = (uint64_t)fn;
      (fn->c).marked = (fn->c).marked & 0xfb;
      gc_traverse_thread(g,(lua_State *)&fn->c);
      return (ulong)*(uint *)((long)fn + 0x58) * 8 + 0x60;
    }
    gc_traverse_trace(g,(GCtrace *)&fn->c);
    uVar3._0_1_ = *(uint8_t *)((long)fn + 10);
    uVar3._1_1_ = *(uint8_t *)((long)fn + 0xb);
    return (ulong)((uint)uVar3 * 0xc) +
           (ulong)(uint)(*(int *)((long)fn + 0xc) - *(int *)&(fn->c).f) * 8 +
           (ulong)*(uint *)((long)&(fn->c).f + 4) * 4 + 0x78;
  }
  pGVar14 = *(GCobj **)((long)fn + 0x20);
  if (pGVar14 != (GCobj *)0x0) {
    if (((pGVar14->gch).marked & 3) != 0) {
      gc_mark(g,pGVar14);
    }
    if (((pGVar14->gch).unused1 & 8) == 0) {
      pcVar10 = lj_meta_cache(&pGVar14->tab,MM_mode,(GCstr *)g->gcroot[3].gcptr64);
      goto LAB_00116680;
    }
  }
  pcVar10 = (cTValue *)0x0;
LAB_00116680:
  uVar15 = 0;
  if ((pcVar10 != (cTValue *)0x0) && (uVar15 = 0, (pcVar10->field_4).it >> 0xf == 0x1fffb)) {
    pcVar11 = (char *)(((ulong)pcVar10->field_4 & 0x7fffffffffff) + 0x18);
    uVar15 = 0;
    while (cVar2 = *pcVar11, cVar2 != '\0') {
      pcVar11 = pcVar11 + 1;
      if (cVar2 == 'v') {
        uVar15 = uVar15 | 0x10;
      }
      else if (cVar2 == 'k') {
        uVar15 = uVar15 | 8;
      }
    }
    if (uVar15 == 0) {
      uVar15 = 0;
    }
    else {
      uVar6 = (g->ctype_state).ptr64;
      if ((uVar6 == 0) || (*(GCfunc **)(uVar6 + 0x20) != fn)) {
        (fn->c).marked = (byte)uVar15 | (fn->c).marked & 0xe7;
        (fn->c).gclist.gcptr64 = (g->gc).weak.gcptr64;
        (g->gc).weak.gcptr64 = (uint64_t)fn;
      }
      else {
        uVar15 = 0xffffffef;
      }
    }
  }
  uVar9 = 1;
  if (uVar15 != 0x18) {
    if (((uVar15 & 0x10) == 0) && (uVar18 = (ulong)(fn->c).upvalue[0].u32.lo, uVar18 != 0)) {
      uVar13 = 0;
      do {
        uVar7 = *(ulong *)((fn->c).env.gcptr64 + uVar13 * 8);
        if (((int)((long)uVar7 >> 0x2f) + 0xdU < 9) &&
           (pGVar14 = (GCobj *)(uVar7 & 0x7fffffffffff), ((pGVar14->gch).marked & 3) != 0)) {
          gc_mark(g,pGVar14);
        }
        uVar13 = uVar13 + 1;
      } while (uVar18 != uVar13);
    }
    uVar4 = (fn->c).upvalue[0].field_4.it;
    uVar9 = uVar15;
    if (uVar4 != 0) {
      p_Var8 = (fn->c).f;
      uVar18 = 0;
      do {
        if (*(long *)(p_Var8 + uVar18 * 0x18) != -1) {
          p_Var16 = p_Var8 + uVar18 * 0x18;
          if ((((uVar15 & 8) == 0) &&
              (uVar13 = *(ulong *)(p_Var16 + 8), (int)((long)uVar13 >> 0x2f) + 0xdU < 9)) &&
             (pGVar14 = (GCobj *)(uVar13 & 0x7fffffffffff), ((pGVar14->gch).marked & 3) != 0)) {
            gc_mark(g,pGVar14);
          }
          if ((((uVar15 & 0x10) == 0) &&
              (uVar13 = *(ulong *)p_Var16, (int)((long)uVar13 >> 0x2f) + 0xdU < 9)) &&
             (pGVar14 = (GCobj *)(uVar13 & 0x7fffffffffff), ((pGVar14->gch).marked & 3) != 0)) {
            gc_mark(g,pGVar14);
          }
        }
        uVar17 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar17;
      } while (uVar17 <= uVar4);
    }
  }
  if (0 < (int)uVar9) {
    (fn->c).marked = (fn->c).marked & 0xfb;
  }
  uVar5 = (fn->c).upvalue[0].field_4.it;
  lVar12 = 0;
  if (uVar5 != 0) {
    lVar12 = (ulong)(uVar5 + 1) * 0x18;
  }
  return lVar12 + (ulong)(fn->c).upvalue[0].u32.lo * 8 + 0x40;
}

Assistant:

static size_t propagatemark(global_State *g)
{
  GCobj *o = gcref(g->gc.gray);
  int gct = o->gch.gct;
  lj_assertG(isgray(o), "propagation of non-gray object");
  gray2black(o);
  setgcrefr(g->gc.gray, o->gch.gclist);  /* Remove from gray list. */
  if (LJ_LIKELY(gct == ~LJ_TTAB)) {
    GCtab *t = gco2tab(o);
    if (gc_traverse_tab(g, t) > 0)
      black2gray(o);  /* Keep weak tables gray. */
    return sizeof(GCtab) + sizeof(TValue) * t->asize +
			   (t->hmask ? sizeof(Node) * (t->hmask + 1) : 0);
  } else if (LJ_LIKELY(gct == ~LJ_TFUNC)) {
    GCfunc *fn = gco2func(o);
    gc_traverse_func(g, fn);
    return isluafunc(fn) ? sizeLfunc((MSize)fn->l.nupvalues) :
			   sizeCfunc((MSize)fn->c.nupvalues);
  } else if (LJ_LIKELY(gct == ~LJ_TPROTO)) {
    GCproto *pt = gco2pt(o);
    gc_traverse_proto(g, pt);
    return pt->sizept;
  } else if (LJ_LIKELY(gct == ~LJ_TTHREAD)) {
    lua_State *th = gco2th(o);
    setgcrefr(th->gclist, g->gc.grayagain);
    setgcref(g->gc.grayagain, o);
    black2gray(o);  /* Threads are never black. */
    gc_traverse_thread(g, th);
    return sizeof(lua_State) + sizeof(TValue) * th->stacksize;
  } else {
#if LJ_HASJIT
    GCtrace *T = gco2trace(o);
    gc_traverse_trace(g, T);
    return ((sizeof(GCtrace)+7)&~7) + (T->nins-T->nk)*sizeof(IRIns) +
	   T->nsnap*sizeof(SnapShot) + T->nsnapmap*sizeof(SnapEntry);
#else
    lj_assertG(0, "bad GC type %d", gct);
    return 0;
#endif
  }
}